

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoveUnusedNames.cpp
# Opt level: O2

unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> __thiscall
wasm::RemoveUnusedNames::create(RemoveUnusedNames *this)

{
  _func_int **local_20;
  
  std::make_unique<wasm::RemoveUnusedNames>();
  (this->
  super_WalkerPass<wasm::PostWalker<wasm::RemoveUnusedNames,_wasm::UnifiedExpressionVisitor<wasm::RemoveUnusedNames,_void>_>_>
  ).super_Pass._vptr_Pass = local_20;
  return (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)
         (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Pass> create() override {
    return std::make_unique<RemoveUnusedNames>();
  }